

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcmaster.c
# Opt level: O0

void select_scan_parameters(j_compress_ptr cinfo)

{
  int *piVar1;
  long *in_RDI;
  jpeg_scan_info *scanptr;
  my_master_ptr master;
  int ci;
  int local_c;
  
  if (in_RDI[0x1f] == 0) {
    if (4 < *(int *)((long)in_RDI + 0x4c)) {
      *(undefined4 *)(*in_RDI + 0x28) = 0x1a;
      *(undefined4 *)(*in_RDI + 0x2c) = *(undefined4 *)((long)in_RDI + 0x4c);
      *(undefined4 *)(*in_RDI + 0x30) = 4;
      (**(code **)*in_RDI)(in_RDI);
    }
    *(undefined4 *)((long)in_RDI + 0x144) = *(undefined4 *)((long)in_RDI + 0x4c);
    for (local_c = 0; local_c < *(int *)((long)in_RDI + 0x4c); local_c = local_c + 1) {
      in_RDI[(long)local_c + 0x29] = in_RDI[0xb] + (long)local_c * 0x60;
    }
    *(undefined4 *)((long)in_RDI + 0x19c) = 0;
    *(undefined4 *)(in_RDI + 0x34) = 0x3f;
    *(undefined4 *)((long)in_RDI + 0x1a4) = 0;
    *(undefined4 *)(in_RDI + 0x35) = 0;
  }
  else {
    piVar1 = (int *)(in_RDI[0x1f] + (long)*(int *)(in_RDI[0x36] + 0x2c) * 0x24);
    *(int *)((long)in_RDI + 0x144) = *piVar1;
    for (local_c = 0; local_c < *piVar1; local_c = local_c + 1) {
      in_RDI[(long)local_c + 0x29] = in_RDI[0xb] + (long)piVar1[(long)local_c + 1] * 0x60;
    }
    *(int *)((long)in_RDI + 0x19c) = piVar1[5];
    *(int *)(in_RDI + 0x34) = piVar1[6];
    *(int *)((long)in_RDI + 0x1a4) = piVar1[7];
    *(int *)(in_RDI + 0x35) = piVar1[8];
  }
  return;
}

Assistant:

LOCAL(void)
select_scan_parameters(j_compress_ptr cinfo)
/* Set up the scan parameters for the current scan */
{
  int ci;

#ifdef C_MULTISCAN_FILES_SUPPORTED
  if (cinfo->scan_info != NULL) {
    /* Prepare for current scan --- the script is already validated */
    my_master_ptr master = (my_master_ptr)cinfo->master;
    const jpeg_scan_info *scanptr = cinfo->scan_info + master->scan_number;

    cinfo->comps_in_scan = scanptr->comps_in_scan;
    for (ci = 0; ci < scanptr->comps_in_scan; ci++) {
      cinfo->cur_comp_info[ci] =
        &cinfo->comp_info[scanptr->component_index[ci]];
    }
    cinfo->Ss = scanptr->Ss;
    cinfo->Se = scanptr->Se;
    cinfo->Ah = scanptr->Ah;
    cinfo->Al = scanptr->Al;
  } else
#endif
  {
    /* Prepare for single sequential-JPEG scan containing all components */
    if (cinfo->num_components > MAX_COMPS_IN_SCAN)
      ERREXIT2(cinfo, JERR_COMPONENT_COUNT, cinfo->num_components,
               MAX_COMPS_IN_SCAN);
    cinfo->comps_in_scan = cinfo->num_components;
    for (ci = 0; ci < cinfo->num_components; ci++) {
      cinfo->cur_comp_info[ci] = &cinfo->comp_info[ci];
    }
    cinfo->Ss = 0;
    cinfo->Se = DCTSIZE2 - 1;
    cinfo->Ah = 0;
    cinfo->Al = 0;
  }
}